

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

int __thiscall procxx::pipe_streambuf::close(pipe_streambuf *this,int __fd)

{
  uint uVar1;
  uint uVar2;
  pipe_end __fd_00;
  pipe_t *this_00;
  pipe_end local_20;
  int local_1c;
  pipe_streambuf *local_18;
  pipe_streambuf *this_local;
  pipe_end end_local;
  
  local_1c = __fd;
  local_18 = this;
  this_local._4_4_ = __fd;
  pipe_ostreambuf::close(&this->super_pipe_ostreambuf,__fd);
  uVar1 = pipe_t::pipe_end::operator_cast_to_unsigned_int((pipe_end *)((long)&this_local + 4));
  local_20 = pipe_t::read_end();
  uVar2 = pipe_t::pipe_end::operator_cast_to_unsigned_int(&local_20);
  if (uVar1 != uVar2) {
    (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))();
    this_00 = stdin_pipe(this);
    __fd_00 = pipe_t::write_end();
    uVar1 = pipe_t::close(this_00,__fd_00.end_);
  }
  return uVar1;
}

Assistant:

void close(pipe_t::pipe_end end) override {
    pipe_ostreambuf::close(end);
    if (end != pipe_t::read_end()) {
      flush();
      stdin_pipe().close(pipe_t::write_end());
    }
  }